

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SetCurrentWindow(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  long lVar2;
  ImGuiTable *pIVar3;
  bool bVar4;
  float fVar5;
  
  pIVar1 = GImGui;
  GImGui->CurrentWindow = window;
  if (window != (ImGuiWindow *)0x0) {
    lVar2 = (long)(window->DC).CurrentTableIdx;
    if (lVar2 == -1) {
      pIVar3 = (ImGuiTable *)0x0;
    }
    else {
      pIVar3 = (pIVar1->Tables).Buf.Data + lVar2;
    }
    pIVar1->CurrentTable = pIVar3;
    pIVar1->CurrentDpiScale = 1.0;
    fVar5 = window->Ctx->FontBaseSize * window->FontWindowScale;
    if (window->ParentWindow != (ImGuiWindow *)0x0) {
      fVar5 = fVar5 * window->ParentWindow->FontWindowScale;
    }
    (pIVar1->DrawListSharedData).FontSize = fVar5;
    pIVar1->FontSize = fVar5;
    pIVar1->FontScale = fVar5 / pIVar1->Font->FontSize;
    if (pIVar3 == (ImGuiTable *)0x0) {
      bVar4 = (window->DC).CurrentColumns == (ImGuiOldColumns *)0x0;
    }
    else {
      bVar4 = false;
    }
    (window->DC).NavIsScrollPushableX = bVar4;
    return;
  }
  pIVar1->CurrentTable = (ImGuiTable *)0x0;
  pIVar1->CurrentDpiScale = 1.0;
  return;
}

Assistant:

static void SetCurrentWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow = window;
    g.CurrentTable = window && window->DC.CurrentTableIdx != -1 ? g.Tables.GetByIndex(window->DC.CurrentTableIdx) : NULL;
    g.CurrentDpiScale = 1.0f; // FIXME-DPI: WIP this is modified in docking
    if (window)
    {
        g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
        g.FontScale = g.FontSize / g.Font->FontSize;
        ImGui::NavUpdateCurrentWindowIsScrollPushableX();
    }
}